

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

BOOL Js::VariableWalkerBase::GetReturnedValue
               (int *index,DiagStackFrame *frame,ResolvedObject *pResolvedObject)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 *puVar5;
  undefined4 extraout_var;
  DebugContext *this;
  ProbeContainer *this_00;
  ReturnedValueList *this_01;
  WriteBarrierPtr *this_02;
  ReturnedValue **ppRVar6;
  ReturnedValue *returnValue;
  ReturnedValueList *returnedValueList;
  ResolvedObject *pResolvedObject_local;
  DiagStackFrame *frame_local;
  int *index_local;
  
  if (pResolvedObject == (ResolvedObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x11f,"(pResolvedObject)","pResolvedObject");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (pResolvedObject->scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x120,"(pResolvedObject->scriptContext)",
                                "pResolvedObject->scriptContext");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (frame == (DiagStackFrame *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x121,"(frame)","frame");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (*index < 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x122,"(index >= 0)","index >= 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  iVar3 = (*frame->_vptr_DiagStackFrame[10])();
  this = ScriptContext::GetDebugContext((ScriptContext *)CONCAT44(extraout_var,iVar3));
  this_00 = DebugContext::GetProbeContainer(this);
  this_01 = Js::ProbeContainer::GetReturnedValueList(this_00);
  if (((this_01 != (ReturnedValueList *)0x0) &&
      (iVar3 = JsUtil::ReadOnlyList<Js::ReturnedValue_*,_Memory::Recycler,_DefaultComparer>::Count
                         (&this_01->
                           super_ReadOnlyList<Js::ReturnedValue_*,_Memory::Recycler,_DefaultComparer>
                         ), 0 < iVar3)) && (bVar2 = DiagStackFrame::IsTopFrame(frame), bVar2)) {
    iVar3 = *index;
    iVar4 = JsUtil::ReadOnlyList<Js::ReturnedValue_*,_Memory::Recycler,_DefaultComparer>::Count
                      (&this_01->
                        super_ReadOnlyList<Js::ReturnedValue_*,_Memory::Recycler,_DefaultComparer>);
    if (iVar3 < iVar4) {
      this_02 = (WriteBarrierPtr *)
                JsUtil::
                List<Js::ReturnedValue_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this_01,*index);
      ppRVar6 = Memory::WriteBarrierPtr::operator_cast_to_ReturnedValue__(this_02);
      GetReturnedValueResolvedObject(*ppRVar6,frame,pResolvedObject);
      return 1;
    }
    iVar3 = JsUtil::ReadOnlyList<Js::ReturnedValue_*,_Memory::Recycler,_DefaultComparer>::Count
                      (&this_01->
                        super_ReadOnlyList<Js::ReturnedValue_*,_Memory::Recycler,_DefaultComparer>);
    *index = *index - iVar3;
  }
  return 0;
}

Assistant:

BOOL VariableWalkerBase::GetReturnedValue(int &index, DiagStackFrame* frame, ResolvedObject* pResolvedObject)
    {
        Assert(pResolvedObject);
        Assert(pResolvedObject->scriptContext);
        Assert(frame);
        Assert(index >= 0);
        ReturnedValueList *returnedValueList = frame->GetScriptContext()->GetDebugContext()->GetProbeContainer()->GetReturnedValueList();

        if (returnedValueList != nullptr && returnedValueList->Count() > 0 && frame->IsTopFrame())
        {
            if (index < returnedValueList->Count())
            {
                ReturnedValue * returnValue = returnedValueList->Item(index);
                VariableWalkerBase::GetReturnedValueResolvedObject(returnValue, frame, pResolvedObject);
                return TRUE;
            }

            // Adjust the index
            index -= returnedValueList->Count();
        }

        return FALSE;
    }